

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool deqp::gls::BuiltinPrecisionTests::contains<tcu::Matrix<float,4,4>>
               (IVal *ival,Matrix<float,_4,_4> *value)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  Vector<float,_4> *value_00;
  Vector<tcu::Interval,_4> *ival_00;
  
  bVar2 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                    ((IVal *)ival,(Vector<float,_4> *)value);
  if (bVar2) {
    ival_00 = (ival->m_data).m_data;
    value_00 = (value->m_data).m_data;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      ival_00 = ival_00 + 1;
      value_00 = value_00 + 1;
      if (uVar3 == 3) break;
      bVar2 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                        (ival_00,value_00);
      uVar1 = uVar3 + 1;
    } while (bVar2);
    bVar2 = 2 < uVar3;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}